

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O2

void aom_smooth_h_predictor_64x32_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  ulong uVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  int y_mask;
  uint uVar40;
  uint8_t *puVar41;
  short sVar42;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  undefined1 auVar43 [16];
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  short sVar59;
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  short sVar64;
  short sVar65;
  short sVar66;
  short sVar67;
  short sVar68;
  short sVar69;
  short sVar70;
  short sVar71;
  short sVar72;
  short sVar73;
  short sVar74;
  short sVar75;
  short sVar76;
  short sVar77;
  short sVar78;
  short sVar79;
  short sVar80;
  short sVar81;
  short sVar82;
  short sVar83;
  short sVar84;
  short sVar85;
  short sVar86;
  short sVar87;
  short sVar88;
  short sVar89;
  short sVar90;
  short sVar91;
  short sVar92;
  short sVar93;
  short sVar94;
  short sVar95;
  short sVar96;
  short sVar97;
  short sVar98;
  short sVar99;
  short sVar100;
  short sVar101;
  short sVar102;
  short sVar103;
  short sVar104;
  short sVar105;
  short sVar106;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  ushort uVar109;
  ushort uVar110;
  ushort uVar112;
  ushort uVar113;
  ushort uVar114;
  ushort uVar115;
  ushort uVar116;
  ushort uVar117;
  ushort uVar118;
  ushort uVar119;
  ushort uVar120;
  ushort uVar121;
  ushort uVar122;
  ushort uVar123;
  ushort uVar124;
  ushort uVar125;
  undefined1 auVar111 [16];
  short sVar126;
  ushort uVar127;
  ushort uVar128;
  short sVar133;
  short sVar136;
  short sVar139;
  short sVar142;
  short sVar145;
  short sVar148;
  undefined1 auVar129 [16];
  ushort uVar134;
  ushort uVar135;
  ushort uVar137;
  ushort uVar138;
  ushort uVar140;
  ushort uVar141;
  ushort uVar143;
  ushort uVar144;
  ushort uVar146;
  ushort uVar147;
  ushort uVar149;
  ushort uVar150;
  short sVar151;
  ushort uVar152;
  ushort uVar153;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  
  auVar43 = pshuflw(ZEXT116(top_row[0x3f]),ZEXT116(top_row[0x3f]),0);
  uVar1 = *(ulong *)left_column;
  sVar49 = auVar43._0_2_;
  sVar50 = auVar43._2_2_;
  auVar2._8_6_ = 0;
  auVar2._0_8_ = uVar1;
  auVar2[0xe] = (char)(uVar1 >> 0x38);
  auVar4._8_4_ = 0;
  auVar4._0_8_ = uVar1;
  auVar4[0xc] = (char)(uVar1 >> 0x30);
  auVar4._13_2_ = auVar2._13_2_;
  auVar8._8_4_ = 0;
  auVar8._0_8_ = uVar1;
  auVar8._12_3_ = auVar4._12_3_;
  auVar12._8_2_ = 0;
  auVar12._0_8_ = uVar1;
  auVar12[10] = (char)(uVar1 >> 0x28);
  auVar12._11_4_ = auVar8._11_4_;
  auVar16._8_2_ = 0;
  auVar16._0_8_ = uVar1;
  auVar16._10_5_ = auVar12._10_5_;
  auVar20[8] = (char)(uVar1 >> 0x20);
  auVar20._0_8_ = uVar1;
  auVar20._9_6_ = auVar16._9_6_;
  auVar28._7_8_ = 0;
  auVar28._0_7_ = auVar20._8_7_;
  auVar32._1_8_ = SUB158(auVar28 << 0x40,7);
  auVar32[0] = (char)(uVar1 >> 0x18);
  auVar32._9_6_ = 0;
  auVar33._1_10_ = SUB1510(auVar32 << 0x30,5);
  auVar33[0] = (char)(uVar1 >> 0x10);
  auVar33._11_4_ = 0;
  auVar26[2] = (char)(uVar1 >> 8);
  auVar26._0_2_ = (ushort)uVar1;
  auVar26._3_12_ = SUB1512(auVar33 << 0x20,3);
  auVar43._0_2_ = (ushort)uVar1 & 0xff;
  auVar43._2_13_ = auVar26._2_13_;
  auVar43[0xf] = 0;
  sVar51 = sVar49 + 0x80;
  sVar52 = sVar50 * 8 + 0x80;
  sVar53 = sVar49 * 0x10 + 0x80;
  sVar54 = sVar50 * 0x17 + 0x80;
  sVar55 = sVar49 * 0x1f + 0x80;
  sVar56 = sVar50 * 0x26 + 0x80;
  sVar57 = sVar49 * 0x2e + 0x80;
  sVar58 = sVar50 * 0x35 + 0x80;
  sVar59 = sVar49 * 0x3c + 0x80;
  sVar60 = sVar50 * 0x43 + 0x80;
  sVar61 = sVar49 * 0x4a + 0x80;
  sVar62 = sVar50 * 0x50 + 0x80;
  sVar63 = sVar49 * 0x57 + 0x80;
  sVar64 = sVar50 * 0x5d + 0x80;
  sVar65 = sVar49 * 100 + 0x80;
  sVar66 = sVar50 * 0x6a + 0x80;
  sVar67 = sVar49 * 0x70 + 0x80;
  sVar68 = sVar50 * 0x76 + 0x80;
  sVar69 = sVar49 * 0x7b + 0x80;
  sVar70 = sVar50 * 0x81 + 0x80;
  sVar71 = sVar49 * 0x87 + 0x80;
  sVar72 = sVar50 * 0x8c + 0x80;
  sVar73 = sVar49 * 0x91 + 0x80;
  sVar74 = sVar50 * 0x96 + 0x80;
  sVar75 = sVar49 * 0x9b + 0x80;
  sVar76 = sVar50 * 0xa0 + 0x80;
  sVar77 = sVar49 * 0xa5 + 0x80;
  sVar78 = sVar50 * 0xaa + 0x80;
  sVar79 = sVar49 * 0xae + 0x80;
  sVar80 = sVar50 * 0xb3 + 0x80;
  sVar81 = sVar49 * 0xb7 + 0x80;
  sVar82 = sVar50 * 0xbb + 0x80;
  sVar83 = sVar49 * 0xbf + 0x80;
  sVar84 = sVar50 * 0xc3 + 0x80;
  sVar85 = sVar49 * 199 + 0x80;
  sVar86 = sVar50 * 0xca + 0x80;
  sVar87 = sVar49 * 0xce + 0x80;
  sVar88 = sVar50 * 0xd1 + 0x80;
  sVar89 = sVar49 * 0xd4 + 0x80;
  sVar90 = sVar50 * 0xd7 + 0x80;
  sVar91 = sVar49 * 0xda + 0x80;
  sVar92 = sVar50 * 0xdd + 0x80;
  sVar93 = sVar49 * 0xe0 + 0x80;
  sVar94 = sVar50 * 0xe3 + 0x80;
  sVar95 = sVar49 * 0xe5 + 0x80;
  sVar96 = sVar50 * 0xe7 + 0x80;
  sVar97 = sVar49 * 0xea + 0x80;
  sVar98 = sVar50 * 0xec + 0x80;
  sVar99 = sVar49 * 0xee + 0x80;
  sVar100 = sVar50 * 0xf0 + 0x80;
  sVar101 = sVar49 * 0xf1 + 0x80;
  sVar102 = sVar50 * 0xf3 + 0x80;
  sVar103 = sVar49 * 0xf4 + 0x80;
  sVar104 = sVar50 * 0xf6 + 0x80;
  sVar105 = sVar49 * 0xf7 + 0x80;
  sVar106 = sVar50 * 0xf8 + 0x80;
  sVar42 = sVar49 * 0xf9 + 0x80;
  sVar44 = sVar50 * 0xfa + 0x80;
  sVar45 = sVar49 * 0xfa + 0x80;
  sVar46 = sVar50 * 0xfb + 0x80;
  sVar47 = sVar49 * 0xfb + 0x80;
  sVar48 = sVar50 * 0xfc + 0x80;
  sVar49 = sVar49 * 0xfc + 0x80;
  sVar50 = sVar50 * 0xfc + 0x80;
  puVar41 = dst + 0x30;
  for (uVar40 = 0x1000100; uVar40 < 0xf0e0f0f; uVar40 = uVar40 + 0x2020202) {
    auVar129._4_4_ = uVar40;
    auVar129._0_4_ = uVar40;
    auVar129._8_4_ = uVar40;
    auVar129._12_4_ = uVar40;
    auVar107 = pshufb(auVar43,auVar129);
    sVar126 = auVar107._0_2_;
    sVar133 = auVar107._2_2_;
    sVar136 = auVar107._4_2_;
    sVar139 = auVar107._6_2_;
    sVar142 = auVar107._8_2_;
    sVar145 = auVar107._10_2_;
    sVar148 = auVar107._12_2_;
    sVar151 = auVar107._14_2_;
    uVar127 = sVar126 * 0xff + sVar51;
    uVar134 = sVar133 * 0xf8 + sVar52;
    uVar137 = sVar136 * 0xf0 + sVar53;
    uVar140 = sVar139 * 0xe9 + sVar54;
    uVar143 = sVar142 * 0xe1 + sVar55;
    uVar146 = sVar145 * 0xda + sVar56;
    uVar149 = sVar148 * 0xd2 + sVar57;
    uVar152 = sVar151 * 0xcb + sVar58;
    uVar128 = uVar127 >> 8;
    uVar135 = uVar134 >> 8;
    uVar138 = uVar137 >> 8;
    uVar141 = uVar140 >> 8;
    uVar144 = uVar143 >> 8;
    uVar147 = uVar146 >> 8;
    uVar150 = uVar149 >> 8;
    uVar153 = uVar152 >> 8;
    uVar109 = sVar126 * 0xc4 + sVar59;
    uVar112 = sVar133 * 0xbd + sVar60;
    uVar114 = sVar136 * 0xb6 + sVar61;
    uVar116 = sVar139 * 0xb0 + sVar62;
    uVar118 = sVar142 * 0xa9 + sVar63;
    uVar120 = sVar145 * 0xa3 + sVar64;
    uVar122 = sVar148 * 0x9c + sVar65;
    uVar124 = sVar151 * 0x96 + sVar66;
    uVar110 = uVar109 >> 8;
    uVar113 = uVar112 >> 8;
    uVar115 = uVar114 >> 8;
    uVar117 = uVar116 >> 8;
    uVar119 = uVar118 >> 8;
    uVar121 = uVar120 >> 8;
    uVar123 = uVar122 >> 8;
    uVar125 = uVar124 >> 8;
    puVar41[-0x30] = (uVar128 != 0) * (uVar128 < 0x100) * (char)(uVar127 >> 8) - (0xff < uVar128);
    puVar41[-0x2f] = (uVar135 != 0) * (uVar135 < 0x100) * (char)(uVar134 >> 8) - (0xff < uVar135);
    puVar41[-0x2e] = (uVar138 != 0) * (uVar138 < 0x100) * (char)(uVar137 >> 8) - (0xff < uVar138);
    puVar41[-0x2d] = (uVar141 != 0) * (uVar141 < 0x100) * (char)(uVar140 >> 8) - (0xff < uVar141);
    puVar41[-0x2c] = (uVar144 != 0) * (uVar144 < 0x100) * (char)(uVar143 >> 8) - (0xff < uVar144);
    puVar41[-0x2b] = (uVar147 != 0) * (uVar147 < 0x100) * (char)(uVar146 >> 8) - (0xff < uVar147);
    puVar41[-0x2a] = (uVar150 != 0) * (uVar150 < 0x100) * (char)(uVar149 >> 8) - (0xff < uVar150);
    puVar41[-0x29] = (uVar153 != 0) * (uVar153 < 0x100) * (char)(uVar152 >> 8) - (0xff < uVar153);
    puVar41[-0x28] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar41[-0x27] = (uVar113 != 0) * (uVar113 < 0x100) * (char)(uVar112 >> 8) - (0xff < uVar113);
    puVar41[-0x26] = (uVar115 != 0) * (uVar115 < 0x100) * (char)(uVar114 >> 8) - (0xff < uVar115);
    puVar41[-0x25] = (uVar117 != 0) * (uVar117 < 0x100) * (char)(uVar116 >> 8) - (0xff < uVar117);
    puVar41[-0x24] = (uVar119 != 0) * (uVar119 < 0x100) * (char)(uVar118 >> 8) - (0xff < uVar119);
    puVar41[-0x23] = (uVar121 != 0) * (uVar121 < 0x100) * (char)(uVar120 >> 8) - (0xff < uVar121);
    puVar41[-0x22] = (uVar123 != 0) * (uVar123 < 0x100) * (char)(uVar122 >> 8) - (0xff < uVar123);
    puVar41[-0x21] = (uVar125 != 0) * (uVar125 < 0x100) * (char)(uVar124 >> 8) - (0xff < uVar125);
    uVar109 = sVar126 * 0x90 + sVar67;
    uVar112 = sVar133 * 0x8a + sVar68;
    uVar114 = sVar136 * 0x85 + sVar69;
    uVar116 = sVar139 * 0x7f + sVar70;
    uVar118 = sVar142 * 0x79 + sVar71;
    uVar120 = sVar145 * 0x74 + sVar72;
    uVar122 = sVar148 * 0x6f + sVar73;
    uVar124 = sVar151 * 0x6a + sVar74;
    uVar110 = uVar109 >> 8;
    uVar113 = uVar112 >> 8;
    uVar115 = uVar114 >> 8;
    uVar117 = uVar116 >> 8;
    uVar119 = uVar118 >> 8;
    uVar121 = uVar120 >> 8;
    uVar123 = uVar122 >> 8;
    uVar125 = uVar124 >> 8;
    uVar127 = sVar126 * 0x65 + sVar75;
    uVar134 = sVar133 * 0x60 + sVar76;
    uVar137 = sVar136 * 0x5b + sVar77;
    uVar140 = sVar139 * 0x56 + sVar78;
    uVar143 = sVar142 * 0x52 + sVar79;
    uVar146 = sVar145 * 0x4d + sVar80;
    uVar149 = sVar148 * 0x49 + sVar81;
    uVar152 = sVar151 * 0x45 + sVar82;
    uVar128 = uVar127 >> 8;
    uVar135 = uVar134 >> 8;
    uVar138 = uVar137 >> 8;
    uVar141 = uVar140 >> 8;
    uVar144 = uVar143 >> 8;
    uVar147 = uVar146 >> 8;
    uVar150 = uVar149 >> 8;
    uVar153 = uVar152 >> 8;
    puVar41[-0x20] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar41[-0x1f] = (uVar113 != 0) * (uVar113 < 0x100) * (char)(uVar112 >> 8) - (0xff < uVar113);
    puVar41[-0x1e] = (uVar115 != 0) * (uVar115 < 0x100) * (char)(uVar114 >> 8) - (0xff < uVar115);
    puVar41[-0x1d] = (uVar117 != 0) * (uVar117 < 0x100) * (char)(uVar116 >> 8) - (0xff < uVar117);
    puVar41[-0x1c] = (uVar119 != 0) * (uVar119 < 0x100) * (char)(uVar118 >> 8) - (0xff < uVar119);
    puVar41[-0x1b] = (uVar121 != 0) * (uVar121 < 0x100) * (char)(uVar120 >> 8) - (0xff < uVar121);
    puVar41[-0x1a] = (uVar123 != 0) * (uVar123 < 0x100) * (char)(uVar122 >> 8) - (0xff < uVar123);
    puVar41[-0x19] = (uVar125 != 0) * (uVar125 < 0x100) * (char)(uVar124 >> 8) - (0xff < uVar125);
    puVar41[-0x18] = (uVar128 != 0) * (uVar128 < 0x100) * (char)(uVar127 >> 8) - (0xff < uVar128);
    puVar41[-0x17] = (uVar135 != 0) * (uVar135 < 0x100) * (char)(uVar134 >> 8) - (0xff < uVar135);
    puVar41[-0x16] = (uVar138 != 0) * (uVar138 < 0x100) * (char)(uVar137 >> 8) - (0xff < uVar138);
    puVar41[-0x15] = (uVar141 != 0) * (uVar141 < 0x100) * (char)(uVar140 >> 8) - (0xff < uVar141);
    puVar41[-0x14] = (uVar144 != 0) * (uVar144 < 0x100) * (char)(uVar143 >> 8) - (0xff < uVar144);
    puVar41[-0x13] = (uVar147 != 0) * (uVar147 < 0x100) * (char)(uVar146 >> 8) - (0xff < uVar147);
    puVar41[-0x12] = (uVar150 != 0) * (uVar150 < 0x100) * (char)(uVar149 >> 8) - (0xff < uVar150);
    puVar41[-0x11] = (uVar153 != 0) * (uVar153 < 0x100) * (char)(uVar152 >> 8) - (0xff < uVar153);
    uVar109 = sVar126 * 0x41 + sVar83;
    uVar112 = sVar133 * 0x3d + sVar84;
    uVar114 = sVar136 * 0x39 + sVar85;
    uVar116 = sVar139 * 0x36 + sVar86;
    uVar118 = sVar142 * 0x32 + sVar87;
    uVar120 = sVar145 * 0x2f + sVar88;
    uVar122 = sVar148 * 0x2c + sVar89;
    uVar124 = sVar151 * 0x29 + sVar90;
    uVar110 = uVar109 >> 8;
    uVar113 = uVar112 >> 8;
    uVar115 = uVar114 >> 8;
    uVar117 = uVar116 >> 8;
    uVar119 = uVar118 >> 8;
    uVar121 = uVar120 >> 8;
    uVar123 = uVar122 >> 8;
    uVar125 = uVar124 >> 8;
    uVar127 = sVar126 * 0x26 + sVar91;
    uVar134 = sVar133 * 0x23 + sVar92;
    uVar137 = sVar136 * 0x20 + sVar93;
    uVar140 = sVar139 * 0x1d + sVar94;
    uVar143 = sVar142 * 0x1b + sVar95;
    uVar146 = sVar145 * 0x19 + sVar96;
    uVar149 = sVar148 * 0x16 + sVar97;
    uVar152 = sVar151 * 0x14 + sVar98;
    uVar128 = uVar127 >> 8;
    uVar135 = uVar134 >> 8;
    uVar138 = uVar137 >> 8;
    uVar141 = uVar140 >> 8;
    uVar144 = uVar143 >> 8;
    uVar147 = uVar146 >> 8;
    uVar150 = uVar149 >> 8;
    uVar153 = uVar152 >> 8;
    puVar41[-0x10] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar41[-0xf] = (uVar113 != 0) * (uVar113 < 0x100) * (char)(uVar112 >> 8) - (0xff < uVar113);
    puVar41[-0xe] = (uVar115 != 0) * (uVar115 < 0x100) * (char)(uVar114 >> 8) - (0xff < uVar115);
    puVar41[-0xd] = (uVar117 != 0) * (uVar117 < 0x100) * (char)(uVar116 >> 8) - (0xff < uVar117);
    puVar41[-0xc] = (uVar119 != 0) * (uVar119 < 0x100) * (char)(uVar118 >> 8) - (0xff < uVar119);
    puVar41[-0xb] = (uVar121 != 0) * (uVar121 < 0x100) * (char)(uVar120 >> 8) - (0xff < uVar121);
    puVar41[-10] = (uVar123 != 0) * (uVar123 < 0x100) * (char)(uVar122 >> 8) - (0xff < uVar123);
    puVar41[-9] = (uVar125 != 0) * (uVar125 < 0x100) * (char)(uVar124 >> 8) - (0xff < uVar125);
    puVar41[-8] = (uVar128 != 0) * (uVar128 < 0x100) * (char)(uVar127 >> 8) - (0xff < uVar128);
    puVar41[-7] = (uVar135 != 0) * (uVar135 < 0x100) * (char)(uVar134 >> 8) - (0xff < uVar135);
    puVar41[-6] = (uVar138 != 0) * (uVar138 < 0x100) * (char)(uVar137 >> 8) - (0xff < uVar138);
    puVar41[-5] = (uVar141 != 0) * (uVar141 < 0x100) * (char)(uVar140 >> 8) - (0xff < uVar141);
    puVar41[-4] = (uVar144 != 0) * (uVar144 < 0x100) * (char)(uVar143 >> 8) - (0xff < uVar144);
    puVar41[-3] = (uVar147 != 0) * (uVar147 < 0x100) * (char)(uVar146 >> 8) - (0xff < uVar147);
    puVar41[-2] = (uVar150 != 0) * (uVar150 < 0x100) * (char)(uVar149 >> 8) - (0xff < uVar150);
    puVar41[-1] = (uVar153 != 0) * (uVar153 < 0x100) * (char)(uVar152 >> 8) - (0xff < uVar153);
    uVar127 = sVar126 * 0x12 + sVar99;
    uVar134 = sVar133 * 0x10 + sVar100;
    uVar137 = sVar136 * 0xf + sVar101;
    uVar140 = sVar139 * 0xd + sVar102;
    uVar143 = sVar142 * 0xc + sVar103;
    uVar146 = sVar145 * 10 + sVar104;
    uVar149 = sVar148 * 9 + sVar105;
    uVar152 = sVar151 * 8 + sVar106;
    uVar128 = uVar127 >> 8;
    uVar135 = uVar134 >> 8;
    uVar138 = uVar137 >> 8;
    uVar141 = uVar140 >> 8;
    uVar144 = uVar143 >> 8;
    uVar147 = uVar146 >> 8;
    uVar150 = uVar149 >> 8;
    uVar153 = uVar152 >> 8;
    uVar109 = sVar126 * 7 + sVar42;
    uVar112 = sVar133 * 6 + sVar44;
    uVar114 = sVar136 * 6 + sVar45;
    uVar116 = sVar139 * 5 + sVar46;
    uVar118 = sVar142 * 5 + sVar47;
    uVar120 = sVar145 * 4 + sVar48;
    uVar122 = sVar148 * 4 + sVar49;
    uVar124 = sVar151 * 4 + sVar50;
    uVar110 = uVar109 >> 8;
    uVar113 = uVar112 >> 8;
    uVar115 = uVar114 >> 8;
    uVar117 = uVar116 >> 8;
    uVar119 = uVar118 >> 8;
    uVar121 = uVar120 >> 8;
    uVar123 = uVar122 >> 8;
    uVar125 = uVar124 >> 8;
    *puVar41 = (uVar128 != 0) * (uVar128 < 0x100) * (char)(uVar127 >> 8) - (0xff < uVar128);
    puVar41[1] = (uVar135 != 0) * (uVar135 < 0x100) * (char)(uVar134 >> 8) - (0xff < uVar135);
    puVar41[2] = (uVar138 != 0) * (uVar138 < 0x100) * (char)(uVar137 >> 8) - (0xff < uVar138);
    puVar41[3] = (uVar141 != 0) * (uVar141 < 0x100) * (char)(uVar140 >> 8) - (0xff < uVar141);
    puVar41[4] = (uVar144 != 0) * (uVar144 < 0x100) * (char)(uVar143 >> 8) - (0xff < uVar144);
    puVar41[5] = (uVar147 != 0) * (uVar147 < 0x100) * (char)(uVar146 >> 8) - (0xff < uVar147);
    puVar41[6] = (uVar150 != 0) * (uVar150 < 0x100) * (char)(uVar149 >> 8) - (0xff < uVar150);
    puVar41[7] = (uVar153 != 0) * (uVar153 < 0x100) * (char)(uVar152 >> 8) - (0xff < uVar153);
    puVar41[8] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar41[9] = (uVar113 != 0) * (uVar113 < 0x100) * (char)(uVar112 >> 8) - (0xff < uVar113);
    puVar41[10] = (uVar115 != 0) * (uVar115 < 0x100) * (char)(uVar114 >> 8) - (0xff < uVar115);
    puVar41[0xb] = (uVar117 != 0) * (uVar117 < 0x100) * (char)(uVar116 >> 8) - (0xff < uVar117);
    puVar41[0xc] = (uVar119 != 0) * (uVar119 < 0x100) * (char)(uVar118 >> 8) - (0xff < uVar119);
    puVar41[0xd] = (uVar121 != 0) * (uVar121 < 0x100) * (char)(uVar120 >> 8) - (0xff < uVar121);
    puVar41[0xe] = (uVar123 != 0) * (uVar123 < 0x100) * (char)(uVar122 >> 8) - (0xff < uVar123);
    puVar41[0xf] = (uVar125 != 0) * (uVar125 < 0x100) * (char)(uVar124 >> 8) - (0xff < uVar125);
    puVar41 = puVar41 + stride;
  }
  uVar1 = *(ulong *)(left_column + 8);
  auVar5._8_6_ = 0;
  auVar5._0_8_ = uVar1;
  auVar5[0xe] = (char)(uVar1 >> 0x38);
  auVar9._8_4_ = 0;
  auVar9._0_8_ = uVar1;
  auVar9[0xc] = (char)(uVar1 >> 0x30);
  auVar9._13_2_ = auVar5._13_2_;
  auVar13._8_4_ = 0;
  auVar13._0_8_ = uVar1;
  auVar13._12_3_ = auVar9._12_3_;
  auVar17._8_2_ = 0;
  auVar17._0_8_ = uVar1;
  auVar17[10] = (char)(uVar1 >> 0x28);
  auVar17._11_4_ = auVar13._11_4_;
  auVar21._8_2_ = 0;
  auVar21._0_8_ = uVar1;
  auVar21._10_5_ = auVar17._10_5_;
  auVar24[8] = (char)(uVar1 >> 0x20);
  auVar24._0_8_ = uVar1;
  auVar24._9_6_ = auVar21._9_6_;
  auVar29._7_8_ = 0;
  auVar29._0_7_ = auVar24._8_7_;
  auVar34._1_8_ = SUB158(auVar29 << 0x40,7);
  auVar34[0] = (char)(uVar1 >> 0x18);
  auVar34._9_6_ = 0;
  auVar35._1_10_ = SUB1510(auVar34 << 0x30,5);
  auVar35[0] = (char)(uVar1 >> 0x10);
  auVar35._11_4_ = 0;
  auVar107._3_12_ = SUB1512(auVar35 << 0x20,3);
  auVar107[2] = (char)(uVar1 >> 8);
  auVar107[0] = (byte)uVar1;
  auVar107[1] = 0;
  auVar107[0xf] = 0;
  for (uVar40 = 0x1000100; uVar40 < 0xf0e0f0f; uVar40 = uVar40 + 0x2020202) {
    auVar130._4_4_ = uVar40;
    auVar130._0_4_ = uVar40;
    auVar130._8_4_ = uVar40;
    auVar130._12_4_ = uVar40;
    auVar43 = pshufb(auVar107,auVar130);
    sVar126 = auVar43._0_2_;
    sVar133 = auVar43._2_2_;
    sVar136 = auVar43._4_2_;
    sVar139 = auVar43._6_2_;
    sVar142 = auVar43._8_2_;
    sVar145 = auVar43._10_2_;
    sVar148 = auVar43._12_2_;
    sVar151 = auVar43._14_2_;
    uVar109 = sVar126 * 0xff + sVar51;
    uVar112 = sVar133 * 0xf8 + sVar52;
    uVar114 = sVar136 * 0xf0 + sVar53;
    uVar116 = sVar139 * 0xe9 + sVar54;
    uVar118 = sVar142 * 0xe1 + sVar55;
    uVar120 = sVar145 * 0xda + sVar56;
    uVar122 = sVar148 * 0xd2 + sVar57;
    uVar124 = sVar151 * 0xcb + sVar58;
    uVar110 = uVar109 >> 8;
    uVar113 = uVar112 >> 8;
    uVar115 = uVar114 >> 8;
    uVar117 = uVar116 >> 8;
    uVar119 = uVar118 >> 8;
    uVar121 = uVar120 >> 8;
    uVar123 = uVar122 >> 8;
    uVar125 = uVar124 >> 8;
    uVar127 = sVar126 * 0xc4 + sVar59;
    uVar134 = sVar133 * 0xbd + sVar60;
    uVar137 = sVar136 * 0xb6 + sVar61;
    uVar140 = sVar139 * 0xb0 + sVar62;
    uVar143 = sVar142 * 0xa9 + sVar63;
    uVar146 = sVar145 * 0xa3 + sVar64;
    uVar149 = sVar148 * 0x9c + sVar65;
    uVar152 = sVar151 * 0x96 + sVar66;
    uVar128 = uVar127 >> 8;
    uVar135 = uVar134 >> 8;
    uVar138 = uVar137 >> 8;
    uVar141 = uVar140 >> 8;
    uVar144 = uVar143 >> 8;
    uVar147 = uVar146 >> 8;
    uVar150 = uVar149 >> 8;
    uVar153 = uVar152 >> 8;
    puVar41[-0x30] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar41[-0x2f] = (uVar113 != 0) * (uVar113 < 0x100) * (char)(uVar112 >> 8) - (0xff < uVar113);
    puVar41[-0x2e] = (uVar115 != 0) * (uVar115 < 0x100) * (char)(uVar114 >> 8) - (0xff < uVar115);
    puVar41[-0x2d] = (uVar117 != 0) * (uVar117 < 0x100) * (char)(uVar116 >> 8) - (0xff < uVar117);
    puVar41[-0x2c] = (uVar119 != 0) * (uVar119 < 0x100) * (char)(uVar118 >> 8) - (0xff < uVar119);
    puVar41[-0x2b] = (uVar121 != 0) * (uVar121 < 0x100) * (char)(uVar120 >> 8) - (0xff < uVar121);
    puVar41[-0x2a] = (uVar123 != 0) * (uVar123 < 0x100) * (char)(uVar122 >> 8) - (0xff < uVar123);
    puVar41[-0x29] = (uVar125 != 0) * (uVar125 < 0x100) * (char)(uVar124 >> 8) - (0xff < uVar125);
    puVar41[-0x28] = (uVar128 != 0) * (uVar128 < 0x100) * (char)(uVar127 >> 8) - (0xff < uVar128);
    puVar41[-0x27] = (uVar135 != 0) * (uVar135 < 0x100) * (char)(uVar134 >> 8) - (0xff < uVar135);
    puVar41[-0x26] = (uVar138 != 0) * (uVar138 < 0x100) * (char)(uVar137 >> 8) - (0xff < uVar138);
    puVar41[-0x25] = (uVar141 != 0) * (uVar141 < 0x100) * (char)(uVar140 >> 8) - (0xff < uVar141);
    puVar41[-0x24] = (uVar144 != 0) * (uVar144 < 0x100) * (char)(uVar143 >> 8) - (0xff < uVar144);
    puVar41[-0x23] = (uVar147 != 0) * (uVar147 < 0x100) * (char)(uVar146 >> 8) - (0xff < uVar147);
    puVar41[-0x22] = (uVar150 != 0) * (uVar150 < 0x100) * (char)(uVar149 >> 8) - (0xff < uVar150);
    puVar41[-0x21] = (uVar153 != 0) * (uVar153 < 0x100) * (char)(uVar152 >> 8) - (0xff < uVar153);
    uVar109 = sVar126 * 0x90 + sVar67;
    uVar112 = sVar133 * 0x8a + sVar68;
    uVar114 = sVar136 * 0x85 + sVar69;
    uVar116 = sVar139 * 0x7f + sVar70;
    uVar118 = sVar142 * 0x79 + sVar71;
    uVar120 = sVar145 * 0x74 + sVar72;
    uVar122 = sVar148 * 0x6f + sVar73;
    uVar124 = sVar151 * 0x6a + sVar74;
    uVar110 = uVar109 >> 8;
    uVar113 = uVar112 >> 8;
    uVar115 = uVar114 >> 8;
    uVar117 = uVar116 >> 8;
    uVar119 = uVar118 >> 8;
    uVar121 = uVar120 >> 8;
    uVar123 = uVar122 >> 8;
    uVar125 = uVar124 >> 8;
    uVar127 = sVar126 * 0x65 + sVar75;
    uVar134 = sVar133 * 0x60 + sVar76;
    uVar137 = sVar136 * 0x5b + sVar77;
    uVar140 = sVar139 * 0x56 + sVar78;
    uVar143 = sVar142 * 0x52 + sVar79;
    uVar146 = sVar145 * 0x4d + sVar80;
    uVar149 = sVar148 * 0x49 + sVar81;
    uVar152 = sVar151 * 0x45 + sVar82;
    uVar128 = uVar127 >> 8;
    uVar135 = uVar134 >> 8;
    uVar138 = uVar137 >> 8;
    uVar141 = uVar140 >> 8;
    uVar144 = uVar143 >> 8;
    uVar147 = uVar146 >> 8;
    uVar150 = uVar149 >> 8;
    uVar153 = uVar152 >> 8;
    puVar41[-0x20] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar41[-0x1f] = (uVar113 != 0) * (uVar113 < 0x100) * (char)(uVar112 >> 8) - (0xff < uVar113);
    puVar41[-0x1e] = (uVar115 != 0) * (uVar115 < 0x100) * (char)(uVar114 >> 8) - (0xff < uVar115);
    puVar41[-0x1d] = (uVar117 != 0) * (uVar117 < 0x100) * (char)(uVar116 >> 8) - (0xff < uVar117);
    puVar41[-0x1c] = (uVar119 != 0) * (uVar119 < 0x100) * (char)(uVar118 >> 8) - (0xff < uVar119);
    puVar41[-0x1b] = (uVar121 != 0) * (uVar121 < 0x100) * (char)(uVar120 >> 8) - (0xff < uVar121);
    puVar41[-0x1a] = (uVar123 != 0) * (uVar123 < 0x100) * (char)(uVar122 >> 8) - (0xff < uVar123);
    puVar41[-0x19] = (uVar125 != 0) * (uVar125 < 0x100) * (char)(uVar124 >> 8) - (0xff < uVar125);
    puVar41[-0x18] = (uVar128 != 0) * (uVar128 < 0x100) * (char)(uVar127 >> 8) - (0xff < uVar128);
    puVar41[-0x17] = (uVar135 != 0) * (uVar135 < 0x100) * (char)(uVar134 >> 8) - (0xff < uVar135);
    puVar41[-0x16] = (uVar138 != 0) * (uVar138 < 0x100) * (char)(uVar137 >> 8) - (0xff < uVar138);
    puVar41[-0x15] = (uVar141 != 0) * (uVar141 < 0x100) * (char)(uVar140 >> 8) - (0xff < uVar141);
    puVar41[-0x14] = (uVar144 != 0) * (uVar144 < 0x100) * (char)(uVar143 >> 8) - (0xff < uVar144);
    puVar41[-0x13] = (uVar147 != 0) * (uVar147 < 0x100) * (char)(uVar146 >> 8) - (0xff < uVar147);
    puVar41[-0x12] = (uVar150 != 0) * (uVar150 < 0x100) * (char)(uVar149 >> 8) - (0xff < uVar150);
    puVar41[-0x11] = (uVar153 != 0) * (uVar153 < 0x100) * (char)(uVar152 >> 8) - (0xff < uVar153);
    uVar109 = sVar126 * 0x41 + sVar83;
    uVar112 = sVar133 * 0x3d + sVar84;
    uVar114 = sVar136 * 0x39 + sVar85;
    uVar116 = sVar139 * 0x36 + sVar86;
    uVar118 = sVar142 * 0x32 + sVar87;
    uVar120 = sVar145 * 0x2f + sVar88;
    uVar122 = sVar148 * 0x2c + sVar89;
    uVar124 = sVar151 * 0x29 + sVar90;
    uVar110 = uVar109 >> 8;
    uVar113 = uVar112 >> 8;
    uVar115 = uVar114 >> 8;
    uVar117 = uVar116 >> 8;
    uVar119 = uVar118 >> 8;
    uVar121 = uVar120 >> 8;
    uVar123 = uVar122 >> 8;
    uVar125 = uVar124 >> 8;
    uVar127 = sVar126 * 0x26 + sVar91;
    uVar134 = sVar133 * 0x23 + sVar92;
    uVar137 = sVar136 * 0x20 + sVar93;
    uVar140 = sVar139 * 0x1d + sVar94;
    uVar143 = sVar142 * 0x1b + sVar95;
    uVar146 = sVar145 * 0x19 + sVar96;
    uVar149 = sVar148 * 0x16 + sVar97;
    uVar152 = sVar151 * 0x14 + sVar98;
    uVar128 = uVar127 >> 8;
    uVar135 = uVar134 >> 8;
    uVar138 = uVar137 >> 8;
    uVar141 = uVar140 >> 8;
    uVar144 = uVar143 >> 8;
    uVar147 = uVar146 >> 8;
    uVar150 = uVar149 >> 8;
    uVar153 = uVar152 >> 8;
    puVar41[-0x10] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar41[-0xf] = (uVar113 != 0) * (uVar113 < 0x100) * (char)(uVar112 >> 8) - (0xff < uVar113);
    puVar41[-0xe] = (uVar115 != 0) * (uVar115 < 0x100) * (char)(uVar114 >> 8) - (0xff < uVar115);
    puVar41[-0xd] = (uVar117 != 0) * (uVar117 < 0x100) * (char)(uVar116 >> 8) - (0xff < uVar117);
    puVar41[-0xc] = (uVar119 != 0) * (uVar119 < 0x100) * (char)(uVar118 >> 8) - (0xff < uVar119);
    puVar41[-0xb] = (uVar121 != 0) * (uVar121 < 0x100) * (char)(uVar120 >> 8) - (0xff < uVar121);
    puVar41[-10] = (uVar123 != 0) * (uVar123 < 0x100) * (char)(uVar122 >> 8) - (0xff < uVar123);
    puVar41[-9] = (uVar125 != 0) * (uVar125 < 0x100) * (char)(uVar124 >> 8) - (0xff < uVar125);
    puVar41[-8] = (uVar128 != 0) * (uVar128 < 0x100) * (char)(uVar127 >> 8) - (0xff < uVar128);
    puVar41[-7] = (uVar135 != 0) * (uVar135 < 0x100) * (char)(uVar134 >> 8) - (0xff < uVar135);
    puVar41[-6] = (uVar138 != 0) * (uVar138 < 0x100) * (char)(uVar137 >> 8) - (0xff < uVar138);
    puVar41[-5] = (uVar141 != 0) * (uVar141 < 0x100) * (char)(uVar140 >> 8) - (0xff < uVar141);
    puVar41[-4] = (uVar144 != 0) * (uVar144 < 0x100) * (char)(uVar143 >> 8) - (0xff < uVar144);
    puVar41[-3] = (uVar147 != 0) * (uVar147 < 0x100) * (char)(uVar146 >> 8) - (0xff < uVar147);
    puVar41[-2] = (uVar150 != 0) * (uVar150 < 0x100) * (char)(uVar149 >> 8) - (0xff < uVar150);
    puVar41[-1] = (uVar153 != 0) * (uVar153 < 0x100) * (char)(uVar152 >> 8) - (0xff < uVar153);
    uVar127 = sVar126 * 0x12 + sVar99;
    uVar134 = sVar133 * 0x10 + sVar100;
    uVar137 = sVar136 * 0xf + sVar101;
    uVar140 = sVar139 * 0xd + sVar102;
    uVar143 = sVar142 * 0xc + sVar103;
    uVar146 = sVar145 * 10 + sVar104;
    uVar149 = sVar148 * 9 + sVar105;
    uVar152 = sVar151 * 8 + sVar106;
    uVar128 = uVar127 >> 8;
    uVar135 = uVar134 >> 8;
    uVar138 = uVar137 >> 8;
    uVar141 = uVar140 >> 8;
    uVar144 = uVar143 >> 8;
    uVar147 = uVar146 >> 8;
    uVar150 = uVar149 >> 8;
    uVar153 = uVar152 >> 8;
    uVar109 = sVar126 * 7 + sVar42;
    uVar112 = sVar133 * 6 + sVar44;
    uVar114 = sVar136 * 6 + sVar45;
    uVar116 = sVar139 * 5 + sVar46;
    uVar118 = sVar142 * 5 + sVar47;
    uVar120 = sVar145 * 4 + sVar48;
    uVar122 = sVar148 * 4 + sVar49;
    uVar124 = sVar151 * 4 + sVar50;
    uVar110 = uVar109 >> 8;
    uVar113 = uVar112 >> 8;
    uVar115 = uVar114 >> 8;
    uVar117 = uVar116 >> 8;
    uVar119 = uVar118 >> 8;
    uVar121 = uVar120 >> 8;
    uVar123 = uVar122 >> 8;
    uVar125 = uVar124 >> 8;
    *puVar41 = (uVar128 != 0) * (uVar128 < 0x100) * (char)(uVar127 >> 8) - (0xff < uVar128);
    puVar41[1] = (uVar135 != 0) * (uVar135 < 0x100) * (char)(uVar134 >> 8) - (0xff < uVar135);
    puVar41[2] = (uVar138 != 0) * (uVar138 < 0x100) * (char)(uVar137 >> 8) - (0xff < uVar138);
    puVar41[3] = (uVar141 != 0) * (uVar141 < 0x100) * (char)(uVar140 >> 8) - (0xff < uVar141);
    puVar41[4] = (uVar144 != 0) * (uVar144 < 0x100) * (char)(uVar143 >> 8) - (0xff < uVar144);
    puVar41[5] = (uVar147 != 0) * (uVar147 < 0x100) * (char)(uVar146 >> 8) - (0xff < uVar147);
    puVar41[6] = (uVar150 != 0) * (uVar150 < 0x100) * (char)(uVar149 >> 8) - (0xff < uVar150);
    puVar41[7] = (uVar153 != 0) * (uVar153 < 0x100) * (char)(uVar152 >> 8) - (0xff < uVar153);
    puVar41[8] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar41[9] = (uVar113 != 0) * (uVar113 < 0x100) * (char)(uVar112 >> 8) - (0xff < uVar113);
    puVar41[10] = (uVar115 != 0) * (uVar115 < 0x100) * (char)(uVar114 >> 8) - (0xff < uVar115);
    puVar41[0xb] = (uVar117 != 0) * (uVar117 < 0x100) * (char)(uVar116 >> 8) - (0xff < uVar117);
    puVar41[0xc] = (uVar119 != 0) * (uVar119 < 0x100) * (char)(uVar118 >> 8) - (0xff < uVar119);
    puVar41[0xd] = (uVar121 != 0) * (uVar121 < 0x100) * (char)(uVar120 >> 8) - (0xff < uVar121);
    puVar41[0xe] = (uVar123 != 0) * (uVar123 < 0x100) * (char)(uVar122 >> 8) - (0xff < uVar123);
    puVar41[0xf] = (uVar125 != 0) * (uVar125 < 0x100) * (char)(uVar124 >> 8) - (0xff < uVar125);
    puVar41 = puVar41 + stride;
  }
  uVar1 = *(ulong *)(left_column + 0x10);
  auVar6._8_6_ = 0;
  auVar6._0_8_ = uVar1;
  auVar6[0xe] = (char)(uVar1 >> 0x38);
  auVar10._8_4_ = 0;
  auVar10._0_8_ = uVar1;
  auVar10[0xc] = (char)(uVar1 >> 0x30);
  auVar10._13_2_ = auVar6._13_2_;
  auVar14._8_4_ = 0;
  auVar14._0_8_ = uVar1;
  auVar14._12_3_ = auVar10._12_3_;
  auVar18._8_2_ = 0;
  auVar18._0_8_ = uVar1;
  auVar18[10] = (char)(uVar1 >> 0x28);
  auVar18._11_4_ = auVar14._11_4_;
  auVar22._8_2_ = 0;
  auVar22._0_8_ = uVar1;
  auVar22._10_5_ = auVar18._10_5_;
  auVar25[8] = (char)(uVar1 >> 0x20);
  auVar25._0_8_ = uVar1;
  auVar25._9_6_ = auVar22._9_6_;
  auVar30._7_8_ = 0;
  auVar30._0_7_ = auVar25._8_7_;
  auVar36._1_8_ = SUB158(auVar30 << 0x40,7);
  auVar36[0] = (char)(uVar1 >> 0x18);
  auVar36._9_6_ = 0;
  auVar37._1_10_ = SUB1510(auVar36 << 0x30,5);
  auVar37[0] = (char)(uVar1 >> 0x10);
  auVar37._11_4_ = 0;
  auVar108._3_12_ = SUB1512(auVar37 << 0x20,3);
  auVar108[2] = (char)(uVar1 >> 8);
  auVar108[0] = (byte)uVar1;
  auVar108[1] = 0;
  auVar108[0xf] = 0;
  for (uVar40 = 0x1000100; uVar40 < 0xf0e0f0f; uVar40 = uVar40 + 0x2020202) {
    auVar131._4_4_ = uVar40;
    auVar131._0_4_ = uVar40;
    auVar131._8_4_ = uVar40;
    auVar131._12_4_ = uVar40;
    auVar43 = pshufb(auVar108,auVar131);
    sVar126 = auVar43._0_2_;
    sVar133 = auVar43._2_2_;
    sVar136 = auVar43._4_2_;
    sVar139 = auVar43._6_2_;
    sVar142 = auVar43._8_2_;
    sVar145 = auVar43._10_2_;
    sVar148 = auVar43._12_2_;
    sVar151 = auVar43._14_2_;
    uVar109 = sVar126 * 0xff + sVar51;
    uVar112 = sVar133 * 0xf8 + sVar52;
    uVar114 = sVar136 * 0xf0 + sVar53;
    uVar116 = sVar139 * 0xe9 + sVar54;
    uVar118 = sVar142 * 0xe1 + sVar55;
    uVar120 = sVar145 * 0xda + sVar56;
    uVar122 = sVar148 * 0xd2 + sVar57;
    uVar124 = sVar151 * 0xcb + sVar58;
    uVar110 = uVar109 >> 8;
    uVar113 = uVar112 >> 8;
    uVar115 = uVar114 >> 8;
    uVar117 = uVar116 >> 8;
    uVar119 = uVar118 >> 8;
    uVar121 = uVar120 >> 8;
    uVar123 = uVar122 >> 8;
    uVar125 = uVar124 >> 8;
    uVar127 = sVar126 * 0xc4 + sVar59;
    uVar134 = sVar133 * 0xbd + sVar60;
    uVar137 = sVar136 * 0xb6 + sVar61;
    uVar140 = sVar139 * 0xb0 + sVar62;
    uVar143 = sVar142 * 0xa9 + sVar63;
    uVar146 = sVar145 * 0xa3 + sVar64;
    uVar149 = sVar148 * 0x9c + sVar65;
    uVar152 = sVar151 * 0x96 + sVar66;
    uVar128 = uVar127 >> 8;
    uVar135 = uVar134 >> 8;
    uVar138 = uVar137 >> 8;
    uVar141 = uVar140 >> 8;
    uVar144 = uVar143 >> 8;
    uVar147 = uVar146 >> 8;
    uVar150 = uVar149 >> 8;
    uVar153 = uVar152 >> 8;
    puVar41[-0x30] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar41[-0x2f] = (uVar113 != 0) * (uVar113 < 0x100) * (char)(uVar112 >> 8) - (0xff < uVar113);
    puVar41[-0x2e] = (uVar115 != 0) * (uVar115 < 0x100) * (char)(uVar114 >> 8) - (0xff < uVar115);
    puVar41[-0x2d] = (uVar117 != 0) * (uVar117 < 0x100) * (char)(uVar116 >> 8) - (0xff < uVar117);
    puVar41[-0x2c] = (uVar119 != 0) * (uVar119 < 0x100) * (char)(uVar118 >> 8) - (0xff < uVar119);
    puVar41[-0x2b] = (uVar121 != 0) * (uVar121 < 0x100) * (char)(uVar120 >> 8) - (0xff < uVar121);
    puVar41[-0x2a] = (uVar123 != 0) * (uVar123 < 0x100) * (char)(uVar122 >> 8) - (0xff < uVar123);
    puVar41[-0x29] = (uVar125 != 0) * (uVar125 < 0x100) * (char)(uVar124 >> 8) - (0xff < uVar125);
    puVar41[-0x28] = (uVar128 != 0) * (uVar128 < 0x100) * (char)(uVar127 >> 8) - (0xff < uVar128);
    puVar41[-0x27] = (uVar135 != 0) * (uVar135 < 0x100) * (char)(uVar134 >> 8) - (0xff < uVar135);
    puVar41[-0x26] = (uVar138 != 0) * (uVar138 < 0x100) * (char)(uVar137 >> 8) - (0xff < uVar138);
    puVar41[-0x25] = (uVar141 != 0) * (uVar141 < 0x100) * (char)(uVar140 >> 8) - (0xff < uVar141);
    puVar41[-0x24] = (uVar144 != 0) * (uVar144 < 0x100) * (char)(uVar143 >> 8) - (0xff < uVar144);
    puVar41[-0x23] = (uVar147 != 0) * (uVar147 < 0x100) * (char)(uVar146 >> 8) - (0xff < uVar147);
    puVar41[-0x22] = (uVar150 != 0) * (uVar150 < 0x100) * (char)(uVar149 >> 8) - (0xff < uVar150);
    puVar41[-0x21] = (uVar153 != 0) * (uVar153 < 0x100) * (char)(uVar152 >> 8) - (0xff < uVar153);
    uVar109 = sVar126 * 0x90 + sVar67;
    uVar112 = sVar133 * 0x8a + sVar68;
    uVar114 = sVar136 * 0x85 + sVar69;
    uVar116 = sVar139 * 0x7f + sVar70;
    uVar118 = sVar142 * 0x79 + sVar71;
    uVar120 = sVar145 * 0x74 + sVar72;
    uVar122 = sVar148 * 0x6f + sVar73;
    uVar124 = sVar151 * 0x6a + sVar74;
    uVar110 = uVar109 >> 8;
    uVar113 = uVar112 >> 8;
    uVar115 = uVar114 >> 8;
    uVar117 = uVar116 >> 8;
    uVar119 = uVar118 >> 8;
    uVar121 = uVar120 >> 8;
    uVar123 = uVar122 >> 8;
    uVar125 = uVar124 >> 8;
    uVar127 = sVar126 * 0x65 + sVar75;
    uVar134 = sVar133 * 0x60 + sVar76;
    uVar137 = sVar136 * 0x5b + sVar77;
    uVar140 = sVar139 * 0x56 + sVar78;
    uVar143 = sVar142 * 0x52 + sVar79;
    uVar146 = sVar145 * 0x4d + sVar80;
    uVar149 = sVar148 * 0x49 + sVar81;
    uVar152 = sVar151 * 0x45 + sVar82;
    uVar128 = uVar127 >> 8;
    uVar135 = uVar134 >> 8;
    uVar138 = uVar137 >> 8;
    uVar141 = uVar140 >> 8;
    uVar144 = uVar143 >> 8;
    uVar147 = uVar146 >> 8;
    uVar150 = uVar149 >> 8;
    uVar153 = uVar152 >> 8;
    puVar41[-0x20] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar41[-0x1f] = (uVar113 != 0) * (uVar113 < 0x100) * (char)(uVar112 >> 8) - (0xff < uVar113);
    puVar41[-0x1e] = (uVar115 != 0) * (uVar115 < 0x100) * (char)(uVar114 >> 8) - (0xff < uVar115);
    puVar41[-0x1d] = (uVar117 != 0) * (uVar117 < 0x100) * (char)(uVar116 >> 8) - (0xff < uVar117);
    puVar41[-0x1c] = (uVar119 != 0) * (uVar119 < 0x100) * (char)(uVar118 >> 8) - (0xff < uVar119);
    puVar41[-0x1b] = (uVar121 != 0) * (uVar121 < 0x100) * (char)(uVar120 >> 8) - (0xff < uVar121);
    puVar41[-0x1a] = (uVar123 != 0) * (uVar123 < 0x100) * (char)(uVar122 >> 8) - (0xff < uVar123);
    puVar41[-0x19] = (uVar125 != 0) * (uVar125 < 0x100) * (char)(uVar124 >> 8) - (0xff < uVar125);
    puVar41[-0x18] = (uVar128 != 0) * (uVar128 < 0x100) * (char)(uVar127 >> 8) - (0xff < uVar128);
    puVar41[-0x17] = (uVar135 != 0) * (uVar135 < 0x100) * (char)(uVar134 >> 8) - (0xff < uVar135);
    puVar41[-0x16] = (uVar138 != 0) * (uVar138 < 0x100) * (char)(uVar137 >> 8) - (0xff < uVar138);
    puVar41[-0x15] = (uVar141 != 0) * (uVar141 < 0x100) * (char)(uVar140 >> 8) - (0xff < uVar141);
    puVar41[-0x14] = (uVar144 != 0) * (uVar144 < 0x100) * (char)(uVar143 >> 8) - (0xff < uVar144);
    puVar41[-0x13] = (uVar147 != 0) * (uVar147 < 0x100) * (char)(uVar146 >> 8) - (0xff < uVar147);
    puVar41[-0x12] = (uVar150 != 0) * (uVar150 < 0x100) * (char)(uVar149 >> 8) - (0xff < uVar150);
    puVar41[-0x11] = (uVar153 != 0) * (uVar153 < 0x100) * (char)(uVar152 >> 8) - (0xff < uVar153);
    uVar109 = sVar126 * 0x41 + sVar83;
    uVar112 = sVar133 * 0x3d + sVar84;
    uVar114 = sVar136 * 0x39 + sVar85;
    uVar116 = sVar139 * 0x36 + sVar86;
    uVar118 = sVar142 * 0x32 + sVar87;
    uVar120 = sVar145 * 0x2f + sVar88;
    uVar122 = sVar148 * 0x2c + sVar89;
    uVar124 = sVar151 * 0x29 + sVar90;
    uVar110 = uVar109 >> 8;
    uVar113 = uVar112 >> 8;
    uVar115 = uVar114 >> 8;
    uVar117 = uVar116 >> 8;
    uVar119 = uVar118 >> 8;
    uVar121 = uVar120 >> 8;
    uVar123 = uVar122 >> 8;
    uVar125 = uVar124 >> 8;
    uVar127 = sVar126 * 0x26 + sVar91;
    uVar134 = sVar133 * 0x23 + sVar92;
    uVar137 = sVar136 * 0x20 + sVar93;
    uVar140 = sVar139 * 0x1d + sVar94;
    uVar143 = sVar142 * 0x1b + sVar95;
    uVar146 = sVar145 * 0x19 + sVar96;
    uVar149 = sVar148 * 0x16 + sVar97;
    uVar152 = sVar151 * 0x14 + sVar98;
    uVar128 = uVar127 >> 8;
    uVar135 = uVar134 >> 8;
    uVar138 = uVar137 >> 8;
    uVar141 = uVar140 >> 8;
    uVar144 = uVar143 >> 8;
    uVar147 = uVar146 >> 8;
    uVar150 = uVar149 >> 8;
    uVar153 = uVar152 >> 8;
    puVar41[-0x10] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar41[-0xf] = (uVar113 != 0) * (uVar113 < 0x100) * (char)(uVar112 >> 8) - (0xff < uVar113);
    puVar41[-0xe] = (uVar115 != 0) * (uVar115 < 0x100) * (char)(uVar114 >> 8) - (0xff < uVar115);
    puVar41[-0xd] = (uVar117 != 0) * (uVar117 < 0x100) * (char)(uVar116 >> 8) - (0xff < uVar117);
    puVar41[-0xc] = (uVar119 != 0) * (uVar119 < 0x100) * (char)(uVar118 >> 8) - (0xff < uVar119);
    puVar41[-0xb] = (uVar121 != 0) * (uVar121 < 0x100) * (char)(uVar120 >> 8) - (0xff < uVar121);
    puVar41[-10] = (uVar123 != 0) * (uVar123 < 0x100) * (char)(uVar122 >> 8) - (0xff < uVar123);
    puVar41[-9] = (uVar125 != 0) * (uVar125 < 0x100) * (char)(uVar124 >> 8) - (0xff < uVar125);
    puVar41[-8] = (uVar128 != 0) * (uVar128 < 0x100) * (char)(uVar127 >> 8) - (0xff < uVar128);
    puVar41[-7] = (uVar135 != 0) * (uVar135 < 0x100) * (char)(uVar134 >> 8) - (0xff < uVar135);
    puVar41[-6] = (uVar138 != 0) * (uVar138 < 0x100) * (char)(uVar137 >> 8) - (0xff < uVar138);
    puVar41[-5] = (uVar141 != 0) * (uVar141 < 0x100) * (char)(uVar140 >> 8) - (0xff < uVar141);
    puVar41[-4] = (uVar144 != 0) * (uVar144 < 0x100) * (char)(uVar143 >> 8) - (0xff < uVar144);
    puVar41[-3] = (uVar147 != 0) * (uVar147 < 0x100) * (char)(uVar146 >> 8) - (0xff < uVar147);
    puVar41[-2] = (uVar150 != 0) * (uVar150 < 0x100) * (char)(uVar149 >> 8) - (0xff < uVar150);
    puVar41[-1] = (uVar153 != 0) * (uVar153 < 0x100) * (char)(uVar152 >> 8) - (0xff < uVar153);
    uVar127 = sVar126 * 0x12 + sVar99;
    uVar134 = sVar133 * 0x10 + sVar100;
    uVar137 = sVar136 * 0xf + sVar101;
    uVar140 = sVar139 * 0xd + sVar102;
    uVar143 = sVar142 * 0xc + sVar103;
    uVar146 = sVar145 * 10 + sVar104;
    uVar149 = sVar148 * 9 + sVar105;
    uVar152 = sVar151 * 8 + sVar106;
    uVar128 = uVar127 >> 8;
    uVar135 = uVar134 >> 8;
    uVar138 = uVar137 >> 8;
    uVar141 = uVar140 >> 8;
    uVar144 = uVar143 >> 8;
    uVar147 = uVar146 >> 8;
    uVar150 = uVar149 >> 8;
    uVar153 = uVar152 >> 8;
    uVar109 = sVar126 * 7 + sVar42;
    uVar112 = sVar133 * 6 + sVar44;
    uVar114 = sVar136 * 6 + sVar45;
    uVar116 = sVar139 * 5 + sVar46;
    uVar118 = sVar142 * 5 + sVar47;
    uVar120 = sVar145 * 4 + sVar48;
    uVar122 = sVar148 * 4 + sVar49;
    uVar124 = sVar151 * 4 + sVar50;
    uVar110 = uVar109 >> 8;
    uVar113 = uVar112 >> 8;
    uVar115 = uVar114 >> 8;
    uVar117 = uVar116 >> 8;
    uVar119 = uVar118 >> 8;
    uVar121 = uVar120 >> 8;
    uVar123 = uVar122 >> 8;
    uVar125 = uVar124 >> 8;
    *puVar41 = (uVar128 != 0) * (uVar128 < 0x100) * (char)(uVar127 >> 8) - (0xff < uVar128);
    puVar41[1] = (uVar135 != 0) * (uVar135 < 0x100) * (char)(uVar134 >> 8) - (0xff < uVar135);
    puVar41[2] = (uVar138 != 0) * (uVar138 < 0x100) * (char)(uVar137 >> 8) - (0xff < uVar138);
    puVar41[3] = (uVar141 != 0) * (uVar141 < 0x100) * (char)(uVar140 >> 8) - (0xff < uVar141);
    puVar41[4] = (uVar144 != 0) * (uVar144 < 0x100) * (char)(uVar143 >> 8) - (0xff < uVar144);
    puVar41[5] = (uVar147 != 0) * (uVar147 < 0x100) * (char)(uVar146 >> 8) - (0xff < uVar147);
    puVar41[6] = (uVar150 != 0) * (uVar150 < 0x100) * (char)(uVar149 >> 8) - (0xff < uVar150);
    puVar41[7] = (uVar153 != 0) * (uVar153 < 0x100) * (char)(uVar152 >> 8) - (0xff < uVar153);
    puVar41[8] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar41[9] = (uVar113 != 0) * (uVar113 < 0x100) * (char)(uVar112 >> 8) - (0xff < uVar113);
    puVar41[10] = (uVar115 != 0) * (uVar115 < 0x100) * (char)(uVar114 >> 8) - (0xff < uVar115);
    puVar41[0xb] = (uVar117 != 0) * (uVar117 < 0x100) * (char)(uVar116 >> 8) - (0xff < uVar117);
    puVar41[0xc] = (uVar119 != 0) * (uVar119 < 0x100) * (char)(uVar118 >> 8) - (0xff < uVar119);
    puVar41[0xd] = (uVar121 != 0) * (uVar121 < 0x100) * (char)(uVar120 >> 8) - (0xff < uVar121);
    puVar41[0xe] = (uVar123 != 0) * (uVar123 < 0x100) * (char)(uVar122 >> 8) - (0xff < uVar123);
    puVar41[0xf] = (uVar125 != 0) * (uVar125 < 0x100) * (char)(uVar124 >> 8) - (0xff < uVar125);
    puVar41 = puVar41 + stride;
  }
  uVar1 = *(ulong *)(left_column + 0x18);
  auVar3._8_6_ = 0;
  auVar3._0_8_ = uVar1;
  auVar3[0xe] = (char)(uVar1 >> 0x38);
  auVar7._8_4_ = 0;
  auVar7._0_8_ = uVar1;
  auVar7[0xc] = (char)(uVar1 >> 0x30);
  auVar7._13_2_ = auVar3._13_2_;
  auVar11._8_4_ = 0;
  auVar11._0_8_ = uVar1;
  auVar11._12_3_ = auVar7._12_3_;
  auVar15._8_2_ = 0;
  auVar15._0_8_ = uVar1;
  auVar15[10] = (char)(uVar1 >> 0x28);
  auVar15._11_4_ = auVar11._11_4_;
  auVar19._8_2_ = 0;
  auVar19._0_8_ = uVar1;
  auVar19._10_5_ = auVar15._10_5_;
  auVar23[8] = (char)(uVar1 >> 0x20);
  auVar23._0_8_ = uVar1;
  auVar23._9_6_ = auVar19._9_6_;
  auVar31._7_8_ = 0;
  auVar31._0_7_ = auVar23._8_7_;
  auVar38._1_8_ = SUB158(auVar31 << 0x40,7);
  auVar38[0] = (char)(uVar1 >> 0x18);
  auVar38._9_6_ = 0;
  auVar39._1_10_ = SUB1510(auVar38 << 0x30,5);
  auVar39[0] = (char)(uVar1 >> 0x10);
  auVar39._11_4_ = 0;
  auVar27[2] = (char)(uVar1 >> 8);
  auVar27._0_2_ = (ushort)uVar1;
  auVar27._3_12_ = SUB1512(auVar39 << 0x20,3);
  auVar111._0_2_ = (ushort)uVar1 & 0xff;
  auVar111._2_13_ = auVar27._2_13_;
  auVar111[0xf] = 0;
  for (uVar40 = 0x1000100; uVar40 < 0xf0e0f0f; uVar40 = uVar40 + 0x2020202) {
    auVar132._4_4_ = uVar40;
    auVar132._0_4_ = uVar40;
    auVar132._8_4_ = uVar40;
    auVar132._12_4_ = uVar40;
    auVar43 = pshufb(auVar111,auVar132);
    sVar126 = auVar43._0_2_;
    sVar133 = auVar43._2_2_;
    sVar136 = auVar43._4_2_;
    sVar139 = auVar43._6_2_;
    sVar142 = auVar43._8_2_;
    sVar145 = auVar43._10_2_;
    sVar148 = auVar43._12_2_;
    sVar151 = auVar43._14_2_;
    uVar109 = sVar126 * 0xff + sVar51;
    uVar112 = sVar133 * 0xf8 + sVar52;
    uVar114 = sVar136 * 0xf0 + sVar53;
    uVar116 = sVar139 * 0xe9 + sVar54;
    uVar118 = sVar142 * 0xe1 + sVar55;
    uVar120 = sVar145 * 0xda + sVar56;
    uVar122 = sVar148 * 0xd2 + sVar57;
    uVar124 = sVar151 * 0xcb + sVar58;
    uVar110 = uVar109 >> 8;
    uVar113 = uVar112 >> 8;
    uVar115 = uVar114 >> 8;
    uVar117 = uVar116 >> 8;
    uVar119 = uVar118 >> 8;
    uVar121 = uVar120 >> 8;
    uVar123 = uVar122 >> 8;
    uVar125 = uVar124 >> 8;
    uVar127 = sVar126 * 0xc4 + sVar59;
    uVar134 = sVar133 * 0xbd + sVar60;
    uVar137 = sVar136 * 0xb6 + sVar61;
    uVar140 = sVar139 * 0xb0 + sVar62;
    uVar143 = sVar142 * 0xa9 + sVar63;
    uVar146 = sVar145 * 0xa3 + sVar64;
    uVar149 = sVar148 * 0x9c + sVar65;
    uVar152 = sVar151 * 0x96 + sVar66;
    uVar128 = uVar127 >> 8;
    uVar135 = uVar134 >> 8;
    uVar138 = uVar137 >> 8;
    uVar141 = uVar140 >> 8;
    uVar144 = uVar143 >> 8;
    uVar147 = uVar146 >> 8;
    uVar150 = uVar149 >> 8;
    uVar153 = uVar152 >> 8;
    puVar41[-0x30] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar41[-0x2f] = (uVar113 != 0) * (uVar113 < 0x100) * (char)(uVar112 >> 8) - (0xff < uVar113);
    puVar41[-0x2e] = (uVar115 != 0) * (uVar115 < 0x100) * (char)(uVar114 >> 8) - (0xff < uVar115);
    puVar41[-0x2d] = (uVar117 != 0) * (uVar117 < 0x100) * (char)(uVar116 >> 8) - (0xff < uVar117);
    puVar41[-0x2c] = (uVar119 != 0) * (uVar119 < 0x100) * (char)(uVar118 >> 8) - (0xff < uVar119);
    puVar41[-0x2b] = (uVar121 != 0) * (uVar121 < 0x100) * (char)(uVar120 >> 8) - (0xff < uVar121);
    puVar41[-0x2a] = (uVar123 != 0) * (uVar123 < 0x100) * (char)(uVar122 >> 8) - (0xff < uVar123);
    puVar41[-0x29] = (uVar125 != 0) * (uVar125 < 0x100) * (char)(uVar124 >> 8) - (0xff < uVar125);
    puVar41[-0x28] = (uVar128 != 0) * (uVar128 < 0x100) * (char)(uVar127 >> 8) - (0xff < uVar128);
    puVar41[-0x27] = (uVar135 != 0) * (uVar135 < 0x100) * (char)(uVar134 >> 8) - (0xff < uVar135);
    puVar41[-0x26] = (uVar138 != 0) * (uVar138 < 0x100) * (char)(uVar137 >> 8) - (0xff < uVar138);
    puVar41[-0x25] = (uVar141 != 0) * (uVar141 < 0x100) * (char)(uVar140 >> 8) - (0xff < uVar141);
    puVar41[-0x24] = (uVar144 != 0) * (uVar144 < 0x100) * (char)(uVar143 >> 8) - (0xff < uVar144);
    puVar41[-0x23] = (uVar147 != 0) * (uVar147 < 0x100) * (char)(uVar146 >> 8) - (0xff < uVar147);
    puVar41[-0x22] = (uVar150 != 0) * (uVar150 < 0x100) * (char)(uVar149 >> 8) - (0xff < uVar150);
    puVar41[-0x21] = (uVar153 != 0) * (uVar153 < 0x100) * (char)(uVar152 >> 8) - (0xff < uVar153);
    uVar109 = sVar126 * 0x90 + sVar67;
    uVar112 = sVar133 * 0x8a + sVar68;
    uVar114 = sVar136 * 0x85 + sVar69;
    uVar116 = sVar139 * 0x7f + sVar70;
    uVar118 = sVar142 * 0x79 + sVar71;
    uVar120 = sVar145 * 0x74 + sVar72;
    uVar122 = sVar148 * 0x6f + sVar73;
    uVar124 = sVar151 * 0x6a + sVar74;
    uVar110 = uVar109 >> 8;
    uVar113 = uVar112 >> 8;
    uVar115 = uVar114 >> 8;
    uVar117 = uVar116 >> 8;
    uVar119 = uVar118 >> 8;
    uVar121 = uVar120 >> 8;
    uVar123 = uVar122 >> 8;
    uVar125 = uVar124 >> 8;
    uVar127 = sVar126 * 0x65 + sVar75;
    uVar134 = sVar133 * 0x60 + sVar76;
    uVar137 = sVar136 * 0x5b + sVar77;
    uVar140 = sVar139 * 0x56 + sVar78;
    uVar143 = sVar142 * 0x52 + sVar79;
    uVar146 = sVar145 * 0x4d + sVar80;
    uVar149 = sVar148 * 0x49 + sVar81;
    uVar152 = sVar151 * 0x45 + sVar82;
    uVar128 = uVar127 >> 8;
    uVar135 = uVar134 >> 8;
    uVar138 = uVar137 >> 8;
    uVar141 = uVar140 >> 8;
    uVar144 = uVar143 >> 8;
    uVar147 = uVar146 >> 8;
    uVar150 = uVar149 >> 8;
    uVar153 = uVar152 >> 8;
    puVar41[-0x20] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar41[-0x1f] = (uVar113 != 0) * (uVar113 < 0x100) * (char)(uVar112 >> 8) - (0xff < uVar113);
    puVar41[-0x1e] = (uVar115 != 0) * (uVar115 < 0x100) * (char)(uVar114 >> 8) - (0xff < uVar115);
    puVar41[-0x1d] = (uVar117 != 0) * (uVar117 < 0x100) * (char)(uVar116 >> 8) - (0xff < uVar117);
    puVar41[-0x1c] = (uVar119 != 0) * (uVar119 < 0x100) * (char)(uVar118 >> 8) - (0xff < uVar119);
    puVar41[-0x1b] = (uVar121 != 0) * (uVar121 < 0x100) * (char)(uVar120 >> 8) - (0xff < uVar121);
    puVar41[-0x1a] = (uVar123 != 0) * (uVar123 < 0x100) * (char)(uVar122 >> 8) - (0xff < uVar123);
    puVar41[-0x19] = (uVar125 != 0) * (uVar125 < 0x100) * (char)(uVar124 >> 8) - (0xff < uVar125);
    puVar41[-0x18] = (uVar128 != 0) * (uVar128 < 0x100) * (char)(uVar127 >> 8) - (0xff < uVar128);
    puVar41[-0x17] = (uVar135 != 0) * (uVar135 < 0x100) * (char)(uVar134 >> 8) - (0xff < uVar135);
    puVar41[-0x16] = (uVar138 != 0) * (uVar138 < 0x100) * (char)(uVar137 >> 8) - (0xff < uVar138);
    puVar41[-0x15] = (uVar141 != 0) * (uVar141 < 0x100) * (char)(uVar140 >> 8) - (0xff < uVar141);
    puVar41[-0x14] = (uVar144 != 0) * (uVar144 < 0x100) * (char)(uVar143 >> 8) - (0xff < uVar144);
    puVar41[-0x13] = (uVar147 != 0) * (uVar147 < 0x100) * (char)(uVar146 >> 8) - (0xff < uVar147);
    puVar41[-0x12] = (uVar150 != 0) * (uVar150 < 0x100) * (char)(uVar149 >> 8) - (0xff < uVar150);
    puVar41[-0x11] = (uVar153 != 0) * (uVar153 < 0x100) * (char)(uVar152 >> 8) - (0xff < uVar153);
    uVar109 = sVar126 * 0x41 + sVar83;
    uVar112 = sVar133 * 0x3d + sVar84;
    uVar114 = sVar136 * 0x39 + sVar85;
    uVar116 = sVar139 * 0x36 + sVar86;
    uVar118 = sVar142 * 0x32 + sVar87;
    uVar120 = sVar145 * 0x2f + sVar88;
    uVar122 = sVar148 * 0x2c + sVar89;
    uVar124 = sVar151 * 0x29 + sVar90;
    uVar110 = uVar109 >> 8;
    uVar113 = uVar112 >> 8;
    uVar115 = uVar114 >> 8;
    uVar117 = uVar116 >> 8;
    uVar119 = uVar118 >> 8;
    uVar121 = uVar120 >> 8;
    uVar123 = uVar122 >> 8;
    uVar125 = uVar124 >> 8;
    uVar127 = sVar126 * 0x26 + sVar91;
    uVar134 = sVar133 * 0x23 + sVar92;
    uVar137 = sVar136 * 0x20 + sVar93;
    uVar140 = sVar139 * 0x1d + sVar94;
    uVar143 = sVar142 * 0x1b + sVar95;
    uVar146 = sVar145 * 0x19 + sVar96;
    uVar149 = sVar148 * 0x16 + sVar97;
    uVar152 = sVar151 * 0x14 + sVar98;
    uVar128 = uVar127 >> 8;
    uVar135 = uVar134 >> 8;
    uVar138 = uVar137 >> 8;
    uVar141 = uVar140 >> 8;
    uVar144 = uVar143 >> 8;
    uVar147 = uVar146 >> 8;
    uVar150 = uVar149 >> 8;
    uVar153 = uVar152 >> 8;
    puVar41[-0x10] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar41[-0xf] = (uVar113 != 0) * (uVar113 < 0x100) * (char)(uVar112 >> 8) - (0xff < uVar113);
    puVar41[-0xe] = (uVar115 != 0) * (uVar115 < 0x100) * (char)(uVar114 >> 8) - (0xff < uVar115);
    puVar41[-0xd] = (uVar117 != 0) * (uVar117 < 0x100) * (char)(uVar116 >> 8) - (0xff < uVar117);
    puVar41[-0xc] = (uVar119 != 0) * (uVar119 < 0x100) * (char)(uVar118 >> 8) - (0xff < uVar119);
    puVar41[-0xb] = (uVar121 != 0) * (uVar121 < 0x100) * (char)(uVar120 >> 8) - (0xff < uVar121);
    puVar41[-10] = (uVar123 != 0) * (uVar123 < 0x100) * (char)(uVar122 >> 8) - (0xff < uVar123);
    puVar41[-9] = (uVar125 != 0) * (uVar125 < 0x100) * (char)(uVar124 >> 8) - (0xff < uVar125);
    puVar41[-8] = (uVar128 != 0) * (uVar128 < 0x100) * (char)(uVar127 >> 8) - (0xff < uVar128);
    puVar41[-7] = (uVar135 != 0) * (uVar135 < 0x100) * (char)(uVar134 >> 8) - (0xff < uVar135);
    puVar41[-6] = (uVar138 != 0) * (uVar138 < 0x100) * (char)(uVar137 >> 8) - (0xff < uVar138);
    puVar41[-5] = (uVar141 != 0) * (uVar141 < 0x100) * (char)(uVar140 >> 8) - (0xff < uVar141);
    puVar41[-4] = (uVar144 != 0) * (uVar144 < 0x100) * (char)(uVar143 >> 8) - (0xff < uVar144);
    puVar41[-3] = (uVar147 != 0) * (uVar147 < 0x100) * (char)(uVar146 >> 8) - (0xff < uVar147);
    puVar41[-2] = (uVar150 != 0) * (uVar150 < 0x100) * (char)(uVar149 >> 8) - (0xff < uVar150);
    puVar41[-1] = (uVar153 != 0) * (uVar153 < 0x100) * (char)(uVar152 >> 8) - (0xff < uVar153);
    uVar127 = sVar126 * 0x12 + sVar99;
    uVar134 = sVar133 * 0x10 + sVar100;
    uVar137 = sVar136 * 0xf + sVar101;
    uVar140 = sVar139 * 0xd + sVar102;
    uVar143 = sVar142 * 0xc + sVar103;
    uVar146 = sVar145 * 10 + sVar104;
    uVar149 = sVar148 * 9 + sVar105;
    uVar152 = sVar151 * 8 + sVar106;
    uVar128 = uVar127 >> 8;
    uVar135 = uVar134 >> 8;
    uVar138 = uVar137 >> 8;
    uVar141 = uVar140 >> 8;
    uVar144 = uVar143 >> 8;
    uVar147 = uVar146 >> 8;
    uVar150 = uVar149 >> 8;
    uVar153 = uVar152 >> 8;
    uVar109 = sVar126 * 7 + sVar42;
    uVar112 = sVar133 * 6 + sVar44;
    uVar114 = sVar136 * 6 + sVar45;
    uVar116 = sVar139 * 5 + sVar46;
    uVar118 = sVar142 * 5 + sVar47;
    uVar120 = sVar145 * 4 + sVar48;
    uVar122 = sVar148 * 4 + sVar49;
    uVar124 = sVar151 * 4 + sVar50;
    uVar110 = uVar109 >> 8;
    uVar113 = uVar112 >> 8;
    uVar115 = uVar114 >> 8;
    uVar117 = uVar116 >> 8;
    uVar119 = uVar118 >> 8;
    uVar121 = uVar120 >> 8;
    uVar123 = uVar122 >> 8;
    uVar125 = uVar124 >> 8;
    *puVar41 = (uVar128 != 0) * (uVar128 < 0x100) * (char)(uVar127 >> 8) - (0xff < uVar128);
    puVar41[1] = (uVar135 != 0) * (uVar135 < 0x100) * (char)(uVar134 >> 8) - (0xff < uVar135);
    puVar41[2] = (uVar138 != 0) * (uVar138 < 0x100) * (char)(uVar137 >> 8) - (0xff < uVar138);
    puVar41[3] = (uVar141 != 0) * (uVar141 < 0x100) * (char)(uVar140 >> 8) - (0xff < uVar141);
    puVar41[4] = (uVar144 != 0) * (uVar144 < 0x100) * (char)(uVar143 >> 8) - (0xff < uVar144);
    puVar41[5] = (uVar147 != 0) * (uVar147 < 0x100) * (char)(uVar146 >> 8) - (0xff < uVar147);
    puVar41[6] = (uVar150 != 0) * (uVar150 < 0x100) * (char)(uVar149 >> 8) - (0xff < uVar150);
    puVar41[7] = (uVar153 != 0) * (uVar153 < 0x100) * (char)(uVar152 >> 8) - (0xff < uVar153);
    puVar41[8] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar41[9] = (uVar113 != 0) * (uVar113 < 0x100) * (char)(uVar112 >> 8) - (0xff < uVar113);
    puVar41[10] = (uVar115 != 0) * (uVar115 < 0x100) * (char)(uVar114 >> 8) - (0xff < uVar115);
    puVar41[0xb] = (uVar117 != 0) * (uVar117 < 0x100) * (char)(uVar116 >> 8) - (0xff < uVar117);
    puVar41[0xc] = (uVar119 != 0) * (uVar119 < 0x100) * (char)(uVar118 >> 8) - (0xff < uVar119);
    puVar41[0xd] = (uVar121 != 0) * (uVar121 < 0x100) * (char)(uVar120 >> 8) - (0xff < uVar121);
    puVar41[0xe] = (uVar123 != 0) * (uVar123 < 0x100) * (char)(uVar122 >> 8) - (0xff < uVar123);
    puVar41[0xf] = (uVar125 != 0) * (uVar125 < 0x100) * (char)(uVar124 >> 8) - (0xff < uVar125);
    puVar41 = puVar41 + stride;
  }
  return;
}

Assistant:

void aom_smooth_h_predictor_64x32_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i top_right = _mm_set1_epi16(top_row[63]);
  const __m128i left1 = cvtepu8_epi16(LoadLo8(left_column));
  const __m128i weights_lolo = LoadUnaligned16(smooth_weights + 60);
  const __m128i weights_lohi = LoadUnaligned16(smooth_weights + 76);
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i weights1 = cvtepu8_epi16(weights_lolo);
  const __m128i weights2 = cvtepu8_epi16(_mm_srli_si128(weights_lolo, 8));
  const __m128i weights3 = cvtepu8_epi16(weights_lohi);
  const __m128i weights4 = cvtepu8_epi16(_mm_srli_si128(weights_lohi, 8));
  const __m128i inverted_weights1 = _mm_sub_epi16(scale, weights1);
  const __m128i inverted_weights2 = _mm_sub_epi16(scale, weights2);
  const __m128i inverted_weights3 = _mm_sub_epi16(scale, weights3);
  const __m128i inverted_weights4 = _mm_sub_epi16(scale, weights4);
  const __m128i scaled_top_right1 =
      _mm_mullo_epi16(inverted_weights1, top_right);
  const __m128i scaled_top_right2 =
      _mm_mullo_epi16(inverted_weights2, top_right);
  const __m128i scaled_top_right3 =
      _mm_mullo_epi16(inverted_weights3, top_right);
  const __m128i scaled_top_right4 =
      _mm_mullo_epi16(inverted_weights4, top_right);
  const __m128i weights_hilo = LoadUnaligned16(smooth_weights + 92);
  const __m128i weights_hihi = LoadUnaligned16(smooth_weights + 108);
  const __m128i weights5 = cvtepu8_epi16(weights_hilo);
  const __m128i weights6 = cvtepu8_epi16(_mm_srli_si128(weights_hilo, 8));
  const __m128i weights7 = cvtepu8_epi16(weights_hihi);
  const __m128i weights8 = cvtepu8_epi16(_mm_srli_si128(weights_hihi, 8));
  const __m128i inverted_weights5 = _mm_sub_epi16(scale, weights5);
  const __m128i inverted_weights6 = _mm_sub_epi16(scale, weights6);
  const __m128i inverted_weights7 = _mm_sub_epi16(scale, weights7);
  const __m128i inverted_weights8 = _mm_sub_epi16(scale, weights8);
  const __m128i scaled_top_right5 =
      _mm_mullo_epi16(inverted_weights5, top_right);
  const __m128i scaled_top_right6 =
      _mm_mullo_epi16(inverted_weights6, top_right);
  const __m128i scaled_top_right7 =
      _mm_mullo_epi16(inverted_weights7, top_right);
  const __m128i scaled_top_right8 =
      _mm_mullo_epi16(inverted_weights8, top_right);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i left_y = _mm_shuffle_epi8(left1, y_select);
    write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                   scaled_top_right1, scaled_top_right2, round);
    write_smooth_directional_sum16(dst + 16, left_y, left_y, weights3, weights4,
                                   scaled_top_right3, scaled_top_right4, round);
    write_smooth_directional_sum16(dst + 32, left_y, left_y, weights5, weights6,
                                   scaled_top_right5, scaled_top_right6, round);
    write_smooth_directional_sum16(dst + 48, left_y, left_y, weights7, weights8,
                                   scaled_top_right7, scaled_top_right8, round);
    dst += stride;
  }
  const __m128i left2 = cvtepu8_epi16(LoadLo8(left_column + 8));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i left_y = _mm_shuffle_epi8(left2, y_select);
    write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                   scaled_top_right1, scaled_top_right2, round);
    write_smooth_directional_sum16(dst + 16, left_y, left_y, weights3, weights4,
                                   scaled_top_right3, scaled_top_right4, round);
    write_smooth_directional_sum16(dst + 32, left_y, left_y, weights5, weights6,
                                   scaled_top_right5, scaled_top_right6, round);
    write_smooth_directional_sum16(dst + 48, left_y, left_y, weights7, weights8,
                                   scaled_top_right7, scaled_top_right8, round);
    dst += stride;
  }
  const __m128i left3 = cvtepu8_epi16(LoadLo8(left_column + 16));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i left_y = _mm_shuffle_epi8(left3, y_select);
    write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                   scaled_top_right1, scaled_top_right2, round);
    write_smooth_directional_sum16(dst + 16, left_y, left_y, weights3, weights4,
                                   scaled_top_right3, scaled_top_right4, round);
    write_smooth_directional_sum16(dst + 32, left_y, left_y, weights5, weights6,
                                   scaled_top_right5, scaled_top_right6, round);
    write_smooth_directional_sum16(dst + 48, left_y, left_y, weights7, weights8,
                                   scaled_top_right7, scaled_top_right8, round);
    dst += stride;
  }
  const __m128i left4 = cvtepu8_epi16(LoadLo8(left_column + 24));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i left_y = _mm_shuffle_epi8(left4, y_select);
    write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                   scaled_top_right1, scaled_top_right2, round);
    write_smooth_directional_sum16(dst + 16, left_y, left_y, weights3, weights4,
                                   scaled_top_right3, scaled_top_right4, round);
    write_smooth_directional_sum16(dst + 32, left_y, left_y, weights5, weights6,
                                   scaled_top_right5, scaled_top_right6, round);
    write_smooth_directional_sum16(dst + 48, left_y, left_y, weights7, weights8,
                                   scaled_top_right7, scaled_top_right8, round);
    dst += stride;
  }
}